

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.h
# Opt level: O0

TypeCluster * __thiscall
BayesianGameWithClusterInfo::GetTypeCluster(BayesianGameWithClusterInfo *this,Index agI,Index tcI)

{
  reference ppTVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  size_type in_stack_ffffffffffffffe8;
  
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
        *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe8);
  ppTVar1 = std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::at
                      ((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)
                       CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe8);
  return *ppTVar1;
}

Assistant:

const TypeCluster* GetTypeCluster(Index agI, Index tcI) const
        {return _m_typeLists.at(agI)->at(tcI);}